

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::NumWorkGroupsCase::NumWorkGroupsCase
          (NumWorkGroupsCase *this,Context *context)

{
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  *this_00;
  undefined1 local_38 [8];
  undefined8 uStack_30;
  undefined1 *local_28 [2];
  
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (&this->super_ComputeBuiltinVarCase,context,"num_work_groups","gl_NumWorkGroups",
             TYPE_UINT_VEC3);
  (this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_02167358;
  local_38 = (undefined1  [8])&DAT_100000001;
  uStack_30 = &DAT_100000001;
  local_28[0] = &DAT_100000001;
  this_00 = &(this->super_ComputeBuiltinVarCase).m_subCases;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_38);
  local_38 = (undefined1  [8])&DAT_100000001;
  uStack_30._0_4_ = 1;
  uStack_30._4_4_ = 0x34;
  local_28[0] = &DAT_100000001;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_38);
  local_38 = (undefined1  [8])&DAT_100000001;
  uStack_30 = &DAT_100000001;
  local_28[0] = (undefined1 *)0x100000027;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_38);
  local_38 = (undefined1  [8])&DAT_100000001;
  uStack_30 = &DAT_100000001;
  local_28[0] = (undefined1 *)0x4e00000001;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_38);
  local_38 = (undefined1  [8])&DAT_100000001;
  uStack_30._0_4_ = 1;
  uStack_30._4_4_ = 4;
  local_28[0] = (undefined1 *)0xb00000007;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_38);
  local_38._0_4_ = 2;
  local_38._4_4_ = 3;
  uStack_30._0_4_ = 4;
  uStack_30._4_4_ = 4;
  local_28[0] = (undefined1 *)0xb00000007;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_38);
  return;
}

Assistant:

NumWorkGroupsCase (Context& context)
		: ComputeBuiltinVarCase(context, "num_work_groups", "gl_NumWorkGroups", TYPE_UINT_VEC3)
	{
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(52,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,39,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,78)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(4,7,11)));
		m_subCases.push_back(SubCase(UVec3(2,3,4), UVec3(4,7,11)));
	}